

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

fct_logger_i * fct_minimal_logger_new(void)

{
  fct_minimal_logger_t *self;
  
  self = (fct_minimal_logger_t *)calloc(1,0xa8);
  if (self == (fct_minimal_logger_t *)0x0) {
    self = (fct_minimal_logger_t *)0x0;
  }
  else {
    fct_logger__init((fct_logger_i *)self);
    (self->vtable).on_chk = fct_minimal_logger__on_chk;
    (self->vtable).on_fctx_end = fct_minimal_logger__on_fctx_end;
    (self->vtable).on_delete = fct_minimal_logger__on_delete;
    fct_nlist__init2(&self->failed_cndtns_list,0);
  }
  return (fct_logger_i *)self;
}

Assistant:

fct_logger_i*
fct_minimal_logger_new(void)
{
    fct_minimal_logger_t *self = (fct_minimal_logger_t*)\
                                 calloc(1,sizeof(fct_minimal_logger_t));
    if ( self == NULL )
    {
        return NULL;
    }
    fct_logger__init((fct_logger_i*)self);
    self->vtable.on_chk = fct_minimal_logger__on_chk;
    self->vtable.on_fctx_end = fct_minimal_logger__on_fctx_end;
    self->vtable.on_delete = fct_minimal_logger__on_delete;
    fct_nlist__init2(&(self->failed_cndtns_list), 0);
    return (fct_logger_i*)self;
}